

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_unrolled_binary_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,bool negate,BaseType expected_type)

{
  BaseType BVar1;
  string *psVar2;
  bool bVar3;
  SPIRType *pSVar4;
  SPIRType *pSVar5;
  uint32_t uVar6;
  char cVar7;
  _Alloc_hider _Var8;
  string expr;
  SPIRType target_type1;
  SPIRType target_type0;
  string local_358;
  uint32_t local_338;
  uint32_t local_334;
  SPIRType *local_330;
  string local_328;
  SPIRType *local_308;
  SPIRType *local_300;
  char *local_2f8;
  string local_2f0;
  undefined1 local_2d0 [192];
  uint *local_210;
  size_t local_208;
  uint local_1f8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b8;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_2f8 = op;
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op0);
  pSVar5 = Compiler::expression_type(&this->super_Compiler,op1);
  local_300 = pSVar4;
  SPIRType::SPIRType((SPIRType *)local_180,pSVar4);
  local_308 = pSVar5;
  SPIRType::SPIRType((SPIRType *)local_2d0,pSVar5);
  local_180._12_4_ = expected_type;
  local_2d0._12_4_ = expected_type;
  local_180._20_4_ = 1;
  local_2d0._20_4_ = 1;
  local_334 = result_type;
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  type_to_glsl_constructor_abi_cxx11_(&local_2f0,this,pSVar4);
  ::std::__cxx11::string::push_back((char)&local_2f0);
  local_338 = result_id;
  local_330 = pSVar4;
  if (pSVar4->vecsize != 0) {
    uVar6 = 0;
    do {
      if (negate) {
        ::std::__cxx11::string::append((char *)&local_2f0);
      }
      if ((expected_type == Unknown) ||
         (BVar1 = *(BaseType *)&(local_300->super_IVariant).field_0xc, BVar1 == expected_type)) {
        to_extract_component_expression_abi_cxx11_(&local_358,this,op0,uVar6);
        ::std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_358._M_dataplus._M_p);
        psVar2 = &local_358;
        _Var8._M_p = local_358._M_dataplus._M_p;
      }
      else {
        to_extract_component_expression_abi_cxx11_(&local_328,this,op0,uVar6);
        bitcast_expression(&local_358,this,(SPIRType *)local_180,BVar1,&local_328);
        ::std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_358._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p);
        }
        psVar2 = &local_328;
        _Var8._M_p = local_328._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var8._M_p != &psVar2->field_2) {
        operator_delete(_Var8._M_p);
      }
      cVar7 = (char)&local_2f0;
      ::std::__cxx11::string::push_back(cVar7);
      ::std::__cxx11::string::append((char *)&local_2f0);
      ::std::__cxx11::string::push_back(cVar7);
      if ((expected_type == Unknown) ||
         (BVar1 = *(BaseType *)&(local_308->super_IVariant).field_0xc, BVar1 == expected_type)) {
        to_extract_component_expression_abi_cxx11_(&local_358,this,op1,uVar6);
        ::std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_358._M_dataplus._M_p);
        psVar2 = &local_358;
        _Var8._M_p = local_358._M_dataplus._M_p;
      }
      else {
        to_extract_component_expression_abi_cxx11_(&local_328,this,op1,uVar6);
        bitcast_expression(&local_358,this,(SPIRType *)local_2d0,BVar1,&local_328);
        ::std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_358._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p);
        }
        psVar2 = &local_328;
        _Var8._M_p = local_328._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var8._M_p != &psVar2->field_2) {
        operator_delete(_Var8._M_p);
      }
      if (negate) {
        ::std::__cxx11::string::append((char *)&local_2f0);
      }
      uVar6 = uVar6 + 1;
      if (uVar6 < local_330->vecsize) {
        ::std::__cxx11::string::append((char *)&local_2f0);
      }
    } while (uVar6 < local_330->vecsize);
  }
  ::std::__cxx11::string::push_back((char)&local_2f0);
  uVar6 = local_338;
  bVar3 = should_forward(this,op0);
  if (bVar3) {
    bVar3 = should_forward(this,op1);
  }
  else {
    bVar3 = false;
  }
  emit_op(this,local_334,uVar6,&local_2f0,bVar3,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,uVar6,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,uVar6,op1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  local_2d0._0_8_ = &PTR__SPIRType_0035b448;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1b8);
  local_208 = 0;
  if (local_210 != local_1f8) {
    free(local_210);
  }
  local_2d0._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_2d0._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_2d0 + 0xa0)) {
    free((void *)local_2d0._136_8_);
  }
  local_2d0._96_8_ = 0;
  if ((undefined1 *)local_2d0._88_8_ != local_2d0 + 0x70) {
    free((void *)local_2d0._88_8_);
  }
  local_2d0._40_8_ = 0;
  if ((undefined1 *)local_2d0._32_8_ != local_2d0 + 0x38) {
    free((void *)local_2d0._32_8_);
  }
  local_180._0_8_ = &PTR__SPIRType_0035b448;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_unrolled_binary_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                           const char *op, bool negate, SPIRType::BaseType expected_type)
{
	auto &type0 = expression_type(op0);
	auto &type1 = expression_type(op1);

	SPIRType target_type0 = type0;
	SPIRType target_type1 = type1;
	target_type0.basetype = expected_type;
	target_type1.basetype = expected_type;
	target_type0.vecsize = 1;
	target_type1.vecsize = 1;

	auto &type = get<SPIRType>(result_type);
	auto expr = type_to_glsl_constructor(type);
	expr += '(';
	for (uint32_t i = 0; i < type.vecsize; i++)
	{
		// Make sure to call to_expression multiple times to ensure
		// that these expressions are properly flushed to temporaries if needed.
		if (negate)
			expr += "!(";

		if (expected_type != SPIRType::Unknown && type0.basetype != expected_type)
			expr += bitcast_expression(target_type0, type0.basetype, to_extract_component_expression(op0, i));
		else
			expr += to_extract_component_expression(op0, i);

		expr += ' ';
		expr += op;
		expr += ' ';

		if (expected_type != SPIRType::Unknown && type1.basetype != expected_type)
			expr += bitcast_expression(target_type1, type1.basetype, to_extract_component_expression(op1, i));
		else
			expr += to_extract_component_expression(op1, i);

		if (negate)
			expr += ")";

		if (i + 1 < type.vecsize)
			expr += ", ";
	}
	expr += ')';
	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1));

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}